

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandListGetDeviceHandle
          (ze_command_list_handle_t hCommandList,ze_device_handle_t *phDevice)

{
  object_t<_ze_device_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  ze_pfnCommandListGetDeviceHandle_t pfnGetDeviceHandle;
  dditable_t *dditable;
  ze_device_handle_t *pp_Stack_20;
  ze_result_t result;
  ze_device_handle_t *phDevice_local;
  ze_command_list_handle_t hCommandList_local;
  
  dditable._4_4_ = 0;
  pfnGetDeviceHandle = *(ze_pfnCommandListGetDeviceHandle_t *)(hCommandList + 8);
  if (*(code **)(pfnGetDeviceHandle + 0x2f8) == (code *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    phDevice_local = *(ze_device_handle_t **)hCommandList;
    pp_Stack_20 = phDevice;
    dditable._4_4_ = (**(code **)(pfnGetDeviceHandle + 0x2f8))(phDevice_local,phDevice);
    hCommandList_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>::
               getInstance<_ze_device_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>
                           *)(context + 0x120),pp_Stack_20,(dditable_t **)&pfnGetDeviceHandle);
      *pp_Stack_20 = (ze_device_handle_t)poVar1;
      hCommandList_local._4_4_ = dditable._4_4_;
    }
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetDeviceHandle(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_device_handle_t* phDevice                    ///< [out] handle of the device on which the command list was created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnGetDeviceHandle = dditable->ze.CommandList.pfnGetDeviceHandle;
        if( nullptr == pfnGetDeviceHandle )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // forward to device-driver
        result = pfnGetDeviceHandle( hCommandList, phDevice );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phDevice = reinterpret_cast<ze_device_handle_t>(
                context->ze_device_factory.getInstance( *phDevice, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }